

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O1

void run_benchmark(char *name,_func_void_void_ptr_int *benchmark,_func_void_void_ptr *setup,
                  _func_void_void_ptr_int *teardown,void *data,int count,int iter)

{
  __time_t _Var1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  timeval tv;
  timeval local_68;
  char *local_58;
  _func_void_void_ptr_int *local_50;
  _func_void_void_ptr *local_48;
  _func_void_void_ptr_int *local_40;
  long local_38;
  
  lVar5 = 0x7fffffffffffffff;
  iVar4 = 10;
  lVar6 = 0;
  lVar3 = 0;
  local_58 = name;
  local_50 = benchmark;
  local_48 = setup;
  local_40 = teardown;
  do {
    if (local_48 != (_func_void_void_ptr *)0x0) {
      (*local_48)(teardown);
    }
    gettimeofday(&local_68,(__timezone_ptr_t)0x0);
    _Var1 = local_68.tv_sec;
    local_38 = local_68.tv_usec;
    (*local_50)(teardown,(int)data);
    gettimeofday(&local_68,(__timezone_ptr_t)0x0);
    lVar2 = (local_68.tv_sec - _Var1) * 1000000 + (local_68.tv_usec - local_38);
    if (lVar2 < lVar5) {
      lVar5 = lVar2;
    }
    if (lVar6 < lVar2) {
      lVar6 = lVar2;
    }
    lVar3 = lVar3 + lVar2;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  printf("%-30s, ",local_58);
  lVar2 = (long)(int)data;
  print_number((lVar5 * 1000000) / lVar2);
  printf("   , ");
  print_number((lVar3 * 100000) / lVar2);
  printf("   , ");
  print_number((lVar6 * 1000000) / lVar2);
  putchar(10);
  return;
}

Assistant:

static void run_benchmark(char *name, void (*benchmark)(void*, int), void (*setup)(void*), void (*teardown)(void*, int), void* data, int count, int iter) {
    int i;
    int64_t min = INT64_MAX;
    int64_t sum = 0;
    int64_t max = 0;
    for (i = 0; i < count; i++) {
        int64_t begin, total;
        if (setup != NULL) {
            setup(data);
        }
        begin = gettime_i64();
        benchmark(data, iter);
        total = gettime_i64() - begin;
        if (teardown != NULL) {
            teardown(data, iter);
        }
        if (total < min) {
            min = total;
        }
        if (total > max) {
            max = total;
        }
        sum += total;
    }
    /* ',' is used as a column delimiter */
    printf("%-30s, ", name);
    print_number(min * FP_MULT / iter);
    printf("   , ");
    print_number(((sum * FP_MULT) / count) / iter);
    printf("   , ");
    print_number(max * FP_MULT / iter);
    printf("\n");
}